

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_checkpoint.cpp
# Opt level: O1

unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true> __thiscall
duckdb::Transformer::TransformCheckpoint(Transformer *this,PGCheckPointStmt *stmt)

{
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var1;
  _Head_base<0UL,_duckdb::FunctionExpression_*,_false> _Var2;
  _Head_base<0UL,_duckdb::CallStatement_*,_false> _Var3;
  Transformer *this_00;
  pointer pFVar4;
  ConstantExpression *this_01;
  pointer pCVar5;
  long in_RDX;
  pointer *__ptr;
  templated_unique_single_t function;
  templated_unique_single_t result;
  char *checkpoint_name;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  children;
  _Head_base<0UL,_duckdb::FunctionExpression_*,_false> local_d8;
  _Head_base<0UL,_duckdb::CallStatement_*,_false> local_d0;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_c8;
  char *local_c0;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  local_b8;
  Value local_a0;
  Value local_60;
  
  local_b8.
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c0 = "checkpoint";
  if (*(char *)(in_RDX + 4) != '\0') {
    local_c0 = "force_checkpoint";
  }
  this_00 = (Transformer *)operator_new(0x80);
  CallStatement::CallStatement((CallStatement *)this_00);
  local_d0._M_head_impl = (CallStatement *)this_00;
  make_uniq<duckdb::FunctionExpression,char_const*&,duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
            ((duckdb *)&local_d8,&local_c0,
             (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
              *)&local_b8);
  pFVar4 = unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
           ::operator->((unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
                         *)&local_d8);
  ::std::__cxx11::string::_M_replace
            ((ulong)&pFVar4->catalog,0,(char *)(pFVar4->catalog)._M_string_length,0x1e3dc5b);
  pFVar4 = unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
           ::operator->((unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
                         *)&local_d8);
  ::std::__cxx11::string::_M_replace
            ((ulong)&pFVar4->schema,0,(char *)(pFVar4->schema)._M_string_length,0x1f1ab6b);
  if (*(long *)(in_RDX + 8) != 0) {
    pFVar4 = unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
             ::operator->((unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
                           *)&local_d8);
    Value::Value(&local_a0,*(char **)(in_RDX + 8));
    this_01 = (ConstantExpression *)operator_new(0x78);
    Value::Value(&local_60,&local_a0);
    ConstantExpression::ConstantExpression(this_01,&local_60);
    Value::~Value(&local_60);
    local_c8._M_head_impl = (ParsedExpression *)this_01;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                *)&pFVar4->children,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)&local_c8);
    if ((ConstantExpression *)local_c8._M_head_impl != (ConstantExpression *)0x0) {
      (*((BaseExpression *)&((local_c8._M_head_impl)->super_BaseExpression)._vptr_BaseExpression)->
        _vptr_BaseExpression[1])();
    }
    local_c8._M_head_impl = (ParsedExpression *)0x0;
    Value::~Value(&local_a0);
  }
  _Var2._M_head_impl = local_d8._M_head_impl;
  local_d8._M_head_impl = (FunctionExpression *)0x0;
  pCVar5 = unique_ptr<duckdb::CallStatement,_std::default_delete<duckdb::CallStatement>,_true>::
           operator->((unique_ptr<duckdb::CallStatement,_std::default_delete<duckdb::CallStatement>,_true>
                       *)&local_d0);
  _Var1._M_head_impl =
       (pCVar5->function).
       super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
       .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
  (pCVar5->function).
  super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
  super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
  .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
       &(_Var2._M_head_impl)->super_ParsedExpression;
  if (_Var1._M_head_impl != (ParsedExpression *)0x0) {
    (**(code **)(*(long *)&(_Var1._M_head_impl)->super_BaseExpression + 8))();
  }
  _Var3._M_head_impl = local_d0._M_head_impl;
  local_d0._M_head_impl = (CallStatement *)0x0;
  (this->parent).ptr = (Transformer *)_Var3._M_head_impl;
  if (local_d8._M_head_impl != (FunctionExpression *)0x0) {
    (*((local_d8._M_head_impl)->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression[1]
    )();
  }
  if (local_d0._M_head_impl != (CallStatement *)0x0) {
    (*((local_d0._M_head_impl)->super_SQLStatement)._vptr_SQLStatement[1])();
  }
  ::std::
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ::~vector(&local_b8);
  return (unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>)
         (unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>)this;
}

Assistant:

unique_ptr<SQLStatement> Transformer::TransformCheckpoint(duckdb_libpgquery::PGCheckPointStmt &stmt) {
	vector<unique_ptr<ParsedExpression>> children;
	// transform into "CALL checkpoint()" or "CALL force_checkpoint()"
	auto checkpoint_name = stmt.force ? "force_checkpoint" : "checkpoint";
	auto result = make_uniq<CallStatement>();
	auto function = make_uniq<FunctionExpression>(checkpoint_name, std::move(children));
	function->catalog = SYSTEM_CATALOG;
	function->schema = DEFAULT_SCHEMA;
	if (stmt.name) {
		function->children.push_back(make_uniq<ConstantExpression>(Value(stmt.name)));
	}
	result->function = std::move(function);
	return std::move(result);
}